

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

float rsg::interpolateFragment(Vec4 *quad,float x,float y)

{
  float fVar1;
  
  if (x + y < 1.0) {
    fVar1 = quad->m_data[0];
    return (quad->m_data[2] - fVar1) * y + (quad->m_data[1] - fVar1) * x + fVar1;
  }
  fVar1 = quad->m_data[3];
  return (quad->m_data[1] - fVar1) * (1.0 - y) + (quad->m_data[2] - fVar1) * (1.0 - x) + fVar1;
}

Assistant:

inline float interpolateFragment (const tcu::Vec4& quad, float x, float y)
{
	if (x + y < 1.0f)
		return interpolateTri(quad.x(), quad.y(), quad.z(), x, y);
	else
		return interpolateTri(quad.w(), quad.z(), quad.y(), 1.0f-x, 1.0f-y);
}